

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O0

void __thiscall
helics::DelayFilterOperation::setString
          (DelayFilterOperation *this,string_view property,string_view val)

{
  string_view timeString;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  bool bVar1;
  size_t in_RDI;
  invalid_argument *anon_var_0;
  atomic<TimeRepresentation<count_time<9,_long>_>_> *in_stack_ffffffffffffff00;
  TimeRepresentation<count_time<9,_long>_> in_stack_ffffffffffffff08;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff20;
  basic_string_view<char,_std::char_traits<char>_> in_stack_ffffffffffffff28;
  
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08.internalTimeCode);
  __y._M_str = in_stack_ffffffffffffff20;
  __y._M_len = in_RDI;
  bVar1 = std::operator==(in_stack_ffffffffffffff28,__y);
  if (bVar1) {
    timeString._M_str = (char *)in_stack_ffffffffffffff08.internalTimeCode;
    timeString._M_len = (size_t)in_stack_ffffffffffffff00;
    gmlc::utilities::loadTimeFromString<TimeRepresentation<count_time<9,long>>>(timeString);
    std::atomic<TimeRepresentation<count_time<9,_long>_>_>::operator=
              (in_stack_ffffffffffffff00,in_stack_ffffffffffffff08);
  }
  return;
}

Assistant:

void DelayFilterOperation::setString(std::string_view property, std::string_view val)
{
    if (property == "delay") {
        try {
            delay = gmlc::utilities::loadTimeFromString<helics::Time>(val);
        }
        catch (const std::invalid_argument&) {
            throw(helics::InvalidParameter(std::string(val) + " is not a valid time string"));
        }
    }
}